

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

substr __thiscall
c4::yml::Parser::_scan_plain_scalar_flow(Parser *this,csubstr currscalar,csubstr peeked_line)

{
  Location LVar1;
  ro_substr s1;
  ro_substr pattern;
  ro_substr s0;
  ro_substr chars;
  ro_substr chars_00;
  Location loc;
  ro_substr chars_01;
  ro_substr chars_02;
  bool bVar2;
  int iVar3;
  error_flags eVar4;
  char *in_RCX;
  Parser *in_RDI;
  char *in_R8;
  basic_substring<char> bVar5;
  substr sVar6;
  Parser *in_stack_000000b0;
  csubstr in_stack_000000b8;
  char msg_1 [72];
  char msg [72];
  first_of_any_result colon_pos;
  csubstr tpkl;
  bool first;
  size_t pos;
  substr full;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  basic_substring<const_char> *in_stack_fffffffffffffc08;
  Location *in_stack_fffffffffffffc10;
  char **in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  size_t in_stack_fffffffffffffc30;
  pfn_error p_Var7;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  undefined7 in_stack_fffffffffffffc40;
  undefined7 uVar8;
  char in_stack_fffffffffffffc47;
  undefined1 uVar9;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  size_t in_stack_fffffffffffffc50;
  undefined1 *puVar10;
  Parser *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  basic_substring<const_char> *in_stack_fffffffffffffc78;
  char **ppcVar11;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  size_t in_stack_fffffffffffffc88;
  Parser *in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcc8 [16];
  basic_substring<char_const> local_318 [16];
  csubstr local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  basic_substring<const_char> *local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  size_t local_2b0;
  char local_2a8 [72];
  char *local_260;
  char *local_258;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined1 local_228 [72];
  char *local_1e0;
  char *local_1d8;
  basic_substring<char_const> local_1d0 [16];
  basic_substring<char_const> local_1c0 [16];
  first_of_any_result local_1b0;
  char *local_1a0;
  char *local_198;
  basic_substring<char_const> local_190 [16];
  basic_substring<char_const> local_180 [16];
  basic_substring<const_char> local_170;
  basic_substring<const_char> local_160;
  byte local_149;
  char *local_148;
  size_t local_140;
  char *local_138;
  char *local_128;
  char *local_120;
  substr *local_f0;
  csubstr *local_e8;
  csubstr *local_e0;
  csubstr *local_d8;
  csubstr *local_d0;
  char **local_c8;
  char **local_c0;
  char **local_b8;
  char **local_b0;
  char **local_a8;
  undefined1 local_99;
  basic_substring<const_char> *local_98;
  char *local_90;
  undefined4 local_88;
  char *local_80;
  char **local_78;
  char *local_70;
  char *local_68;
  undefined8 local_50;
  char **local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined4 local_28;
  char *local_20;
  char **local_18;
  char *local_10;
  char *local_8;
  
  local_148 = "[]{}?#,";
  local_140 = 7;
  chars.str._7_1_ = in_stack_fffffffffffffc47;
  chars.str._0_7_ = in_stack_fffffffffffffc40;
  chars.len._0_7_ = in_stack_fffffffffffffc48;
  chars.len._7_1_ = in_stack_fffffffffffffc4f;
  local_128 = in_RCX;
  local_120 = in_R8;
  local_138 = (char *)basic_substring<const_char>::first_of
                                ((basic_substring<const_char> *)
                                 CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38),chars
                                 ,in_stack_fffffffffffffc30);
  local_149 = 1;
  do {
    if (local_138 == (char *)0x0) {
LAB_00314b78:
      local_f0 = &in_RDI->m_buf;
      basic_substring<char>::basic_substring
                ((basic_substring<char> *)
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (char *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      basic_substring<char_const>::basic_substring<4ul>
                ((basic_substring<char_const> *)&stack0xfffffffffffffcb8,(char (*) [4])"\n\r ");
      chars_01.len = (size_t)in_stack_fffffffffffffc68;
      chars_01.str = in_stack_fffffffffffffc60;
      bVar5 = basic_substring<char>::trimr
                        ((basic_substring<char> *)in_stack_fffffffffffffc58,chars_01);
      sVar6.str = bVar5.str;
      sVar6.len = bVar5.len;
      return sVar6;
    }
    bVar2 = has_all(in_RDI,0x44);
    if ((bVar2) || (bVar2 = has_any(in_RDI,2), bVar2)) {
      local_170 = basic_substring<const_char>::triml
                            ((basic_substring<const_char> *)
                             CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                             in_stack_fffffffffffffc47);
      basic_substring<char_const>::basic_substring<3ul>(local_180,(char (*) [3])0x358dd2);
      chars_02.str._7_1_ = in_stack_fffffffffffffc87;
      chars_02.str._0_7_ = in_stack_fffffffffffffc80;
      chars_02.len = in_stack_fffffffffffffc88;
      local_160 = basic_substring<const_char>::trimr(in_stack_fffffffffffffc78,chars_02);
      basic_substring<char_const>::basic_substring<3ul>(local_190,(char (*) [3])0x345ed3);
      pattern.len = (size_t)in_stack_fffffffffffffc18;
      pattern.str = (char *)in_stack_fffffffffffffc10;
      bVar2 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffc08,pattern);
      if (!bVar2) {
        local_98 = &local_160;
        local_99 = 0x3a;
        iVar3 = basic_substring<const_char>::compare
                          (in_stack_fffffffffffffc08,(char)((uint)in_stack_fffffffffffffc04 >> 0x18)
                          );
        if (iVar3 != 0) {
          basic_substring<char_const>::basic_substring<3ul>(local_1c0,(char (*) [3])0x345ed3);
          basic_substring<char_const>::basic_substring<2ul>(local_1d0,(char (*) [2])0x358938);
          s0.len._0_7_ = in_stack_fffffffffffffc20;
          s0.str = (char *)in_stack_fffffffffffffc18;
          s0.len._7_1_ = in_stack_fffffffffffffc27;
          s1.len = (size_t)in_stack_fffffffffffffc10;
          s1.str = (char *)in_stack_fffffffffffffc08;
          local_1b0 = basic_substring<const_char>::first_of_any
                                ((basic_substring<const_char> *)
                                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),s0,s1
                                );
          bVar2 = basic_substring::first_of_any_result::operator_cast_to_bool
                            ((first_of_any_result *)&local_1b0);
          if ((!bVar2) || (local_138 <= local_1b0.pos)) goto LAB_003146ea;
          ppcVar11 = &local_128;
          local_80 = (char *)local_1b0.pos;
          local_78 = ppcVar11;
          if (local_120 < local_1b0.pos && (char *)local_1b0.pos != (char *)0xffffffffffffffff) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            local_90 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_88 = 0x154e;
            handle_error(0x344e8b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
          }
          in_stack_fffffffffffffc68 = *ppcVar11;
          in_stack_fffffffffffffc60 = local_80;
          if (local_80 == (char *)0xffffffffffffffff) {
            in_stack_fffffffffffffc60 = ppcVar11[1];
          }
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)in_stack_fffffffffffffc10,
                     (char *)in_stack_fffffffffffffc08,
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
          local_1e0 = local_70;
          local_1d8 = local_68;
          local_128 = local_70;
          local_120 = local_68;
          local_b0 = &local_128;
          local_d0 = &(in_RDI->m_state->line_contents).rem;
          if (local_70 + (long)local_68 < local_d0->str) {
            memcpy(local_228,
                   "check failed: (peeked_line.end() >= m_state->line_contents.rem.begin())",0x48);
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            in_stack_fffffffffffffc58 = (Parser *)(in_RDI->m_stack).m_callbacks.m_error;
            puVar10 = local_228;
            Location::Location(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                               CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
            (*(code *)in_stack_fffffffffffffc58)
                      (puVar10,0x48,(in_RDI->m_stack).m_callbacks.m_user_data);
            in_stack_fffffffffffffbf0 = uStack_248;
            in_stack_fffffffffffffbf4 = uStack_244;
            in_stack_fffffffffffffbf8 = local_240;
            in_stack_fffffffffffffbfc = uStack_23c;
            in_stack_fffffffffffffc00 = uStack_238;
            in_stack_fffffffffffffc04 = uStack_234;
          }
          local_b8 = &local_128;
          local_d8 = &(in_RDI->m_state->line_contents).rem;
          _line_progressed(in_stack_fffffffffffffcc8._8_8_,in_stack_fffffffffffffcc8._0_8_);
          goto LAB_00314b78;
        }
      }
      local_48 = &local_128;
      local_50 = 0;
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)in_stack_fffffffffffffc10,
                 (char *)in_stack_fffffffffffffc08,
                 CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      local_1a0 = local_40;
      local_198 = local_38;
      local_128 = local_40;
      local_120 = local_38;
      goto LAB_00314b78;
    }
LAB_003146ea:
    if (local_138 != (char *)0xffffffffffffffff) {
      local_18 = &local_128;
      local_20 = local_138;
      uVar8 = SUB87(local_18,0);
      uVar9 = (undefined1)((ulong)local_18 >> 0x38);
      if (local_120 < local_138 && local_138 != (char *)0xffffffffffffffff) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        local_30 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_28 = 0x1569;
        handle_error(0x344e8b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
      }
      if (local_20 == (char *)0xffffffffffffffff) {
        local_10 = *(char **)CONCAT17(uVar9,uVar8);
        local_8 = (char *)((undefined8 *)CONCAT17(uVar9,uVar8))[1];
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)in_stack_fffffffffffffc10,
                   (char *)in_stack_fffffffffffffc08,
                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      }
      local_260 = local_10;
      local_258 = local_8;
      local_128 = local_10;
      local_120 = local_8;
      local_c0 = &local_128;
      local_e0 = &(in_RDI->m_state->line_contents).rem;
      if (local_10 + (long)local_8 < local_e0->str) {
        memcpy(local_2a8,"check failed: (peeked_line.end() >= m_state->line_contents.rem.begin())",
               0x48);
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        p_Var7 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location(in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                           CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        in_stack_fffffffffffffbf8 = (undefined4)local_2c0;
        in_stack_fffffffffffffbfc = (undefined4)((ulong)local_2c0 >> 0x20);
        in_stack_fffffffffffffc00 = (undefined4)uStack_2b8;
        in_stack_fffffffffffffc04 = (undefined4)((ulong)uStack_2b8 >> 0x20);
        in_stack_fffffffffffffbf0 = (undefined4)uStack_2c8;
        in_stack_fffffffffffffbf4 = (undefined4)((ulong)uStack_2c8 >> 0x20);
        LVar1.super_LineCol.line._0_4_ = in_stack_fffffffffffffbf0;
        LVar1.super_LineCol.offset = local_2d0;
        LVar1.super_LineCol.line._4_4_ = in_stack_fffffffffffffbf4;
        LVar1.super_LineCol.col._0_4_ = in_stack_fffffffffffffbf8;
        LVar1.super_LineCol.col._4_4_ = in_stack_fffffffffffffbfc;
        LVar1.name.str._0_4_ = in_stack_fffffffffffffc00;
        LVar1.name.str._4_4_ = in_stack_fffffffffffffc04;
        LVar1.name.len = local_2b0;
        (*p_Var7)(local_2a8,0x48,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
      }
      local_c8 = &local_128;
      local_e8 = &(in_RDI->m_state->line_contents).rem;
      _line_progressed(in_stack_fffffffffffffcc8._8_8_,in_stack_fffffffffffffcc8._0_8_);
      goto LAB_00314b78;
    }
    if (((local_149 & 1) == 0) && (bVar2 = _advance_to_peeked(in_stack_fffffffffffffcb8), !bVar2)) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location((Location *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                         (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      in_stack_fffffffffffffbf8 = (undefined4)local_2e8;
      in_stack_fffffffffffffbfc = (undefined4)((ulong)local_2e8 >> 0x20);
      in_stack_fffffffffffffc00 = (undefined4)uStack_2e0;
      in_stack_fffffffffffffc04 = (undefined4)((ulong)uStack_2e0 >> 0x20);
      in_stack_fffffffffffffbe8 = (undefined4)local_2f8;
      in_stack_fffffffffffffbec = (undefined4)((ulong)local_2f8 >> 0x20);
      in_stack_fffffffffffffbf0 = (undefined4)uStack_2f0;
      in_stack_fffffffffffffbf4 = (undefined4)((ulong)uStack_2f0 >> 0x20);
      loc.super_LineCol.line = (size_t)in_stack_fffffffffffffc58;
      loc.super_LineCol.offset = in_stack_fffffffffffffc50;
      loc.super_LineCol.col = (size_t)in_stack_fffffffffffffc60;
      loc.name.str = in_stack_fffffffffffffc68;
      loc.name.len._0_7_ = in_stack_fffffffffffffc70;
      loc.name.len._7_1_ = in_stack_fffffffffffffc77;
      in_stack_fffffffffffffc08 = local_2d8;
      error<35ul>((char (*) [35])CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),loc);
    }
    local_308 = _scan_to_next_nonempty_line(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    local_128 = local_308.str;
    local_120 = (char *)local_308.len;
    in_stack_fffffffffffffc18 = &local_128;
    in_stack_fffffffffffffc27 = (char *)local_308.len == (char *)0x0 || local_308.str == (char *)0x0
    ;
    local_a8 = in_stack_fffffffffffffc18;
    if ((bool)in_stack_fffffffffffffc27) {
      bVar2 = is_debugger_attached();
      if ((bVar2) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<38ul>
                (local_318,(char (*) [38])"ERROR: expected token or continuation");
      _err<>(in_stack_000000b0,in_stack_000000b8);
    }
    chars_00.str._7_1_ = in_stack_fffffffffffffc47;
    chars_00.str._0_7_ = in_stack_fffffffffffffc40;
    chars_00.len._0_7_ = in_stack_fffffffffffffc48;
    chars_00.len._7_1_ = in_stack_fffffffffffffc4f;
    local_138 = (char *)basic_substring<const_char>::first_of
                                  ((basic_substring<const_char> *)
                                   CONCAT17(in_stack_fffffffffffffc3f,in_stack_fffffffffffffc38),
                                   chars_00,in_stack_fffffffffffffc30);
    local_149 = 0;
  } while( true );
}

Assistant:

substr Parser::_scan_plain_scalar_flow(csubstr currscalar, csubstr peeked_line)
{
    static constexpr const csubstr chars = "[]{}?#,";
    size_t pos = peeked_line.first_of(chars);
    bool first = true;
    while(pos != 0)
    {
        if(has_all(RMAP|RKEY) || has_any(RUNK))
        {
            csubstr tpkl = peeked_line.triml(' ').trimr("\r\n");
            if(tpkl.begins_with(": ") || tpkl == ':')
            {
                _c4dbgpf("rscalar[FLOW]: map value starts on the peeked line: '{}'", peeked_line);
                peeked_line = peeked_line.first(0);
                break;
            }
            else
            {
                auto colon_pos = peeked_line.first_of_any(": ", ":");
                if(colon_pos && colon_pos.pos < pos)
                {
                    peeked_line = peeked_line.first(colon_pos.pos);
                    _c4dbgpf("rscalar[FLOW]: found colon at {}. peeked='{}'", colon_pos.pos, peeked_line);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.end() >= m_state->line_contents.rem.begin());
                    _line_progressed(static_cast<size_t>(peeked_line.end() - m_state->line_contents.rem.begin()));
                    break;
                }
            }
        }
        if(pos != npos)
        {
            _c4dbgpf("rscalar[FLOW]: found special character '{}' at {}, stopping: '{}'", peeked_line[pos], pos, peeked_line.left_of(pos).trimr("\r\n"));
            peeked_line = peeked_line.left_of(pos);
            _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.end() >= m_state->line_contents.rem.begin());
            _line_progressed(static_cast<size_t>(peeked_line.end() - m_state->line_contents.rem.begin()));
            break;
        }
        _c4dbgpf("rscalar[FLOW]: append another line, full: '{}'", peeked_line.trimr("\r\n"));
        if(!first)
        {
            RYML_CHECK(_advance_to_peeked());
        }
        peeked_line = _scan_to_next_nonempty_line(/*indentation*/0);
        if(peeked_line.empty())
        {
            _c4err("expected token or continuation");
        }
        pos = peeked_line.first_of(chars);
        first = false;
    }
    substr full(m_buf.str + (currscalar.str - m_buf.str), m_buf.begin() + m_state->pos.offset);
    full = full.trimr("\n\r ");
    return full;
}